

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_doFollowPlayer(void)

{
  long lVar1;
  double dVar2;
  double sy;
  double sx;
  double local_38;
  double local_30;
  DAngle local_28;
  
  lVar1 = (&DAT_017e1fb8)[(long)consoleplayer * 0x54];
  if (lVar1 != 0) {
    if ((*(byte *)(lVar1 + 0x20) & 0x20) == 0) {
      local_30 = *(double *)(lVar1 + 0x48);
      if ((_ZL8f_oldloc_0 != local_30) || (NAN(_ZL8f_oldloc_0) || NAN(local_30))) {
        dVar2 = *(double *)(lVar1 + 0x50);
      }
      else {
        dVar2 = *(double *)(lVar1 + 0x50);
        if ((_ZL8f_oldloc_1 == dVar2) && (!NAN(_ZL8f_oldloc_1) && !NAN(dVar2))) {
          return;
        }
      }
      m_x = local_30 - m_w * 0.5;
      local_38 = _ZL8f_oldloc_1 - dVar2;
      m_y = dVar2 - m_h * 0.5;
      m_x2 = m_x + m_w;
      m_y2 = m_y + m_h;
      local_30 = local_30 - _ZL8f_oldloc_0;
      if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive)))) {
        local_28.Degrees = *(double *)(lVar1 + 0xb0) + -90.0;
        AM_rotate(&local_30,&local_38,&local_28);
      }
      AM_ScrollParchment(local_30,local_38);
      _ZL8f_oldloc_0 = *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0x48);
      _ZL8f_oldloc_1 = *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0x50);
    }
    else {
      (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
    }
  }
  return;
}

Assistant:

void AM_doFollowPlayer ()
{
	double sx, sy;

    if (players[consoleplayer].camera != NULL &&
		(f_oldloc.x != players[consoleplayer].camera->X() ||
		 f_oldloc.y != players[consoleplayer].camera->Y()))
	{
		m_x = players[consoleplayer].camera->X() - m_w/2;
		m_y = players[consoleplayer].camera->Y() - m_h/2;
		m_x2 = m_x + m_w;
		m_y2 = m_y + m_h;

  		// do the parallax parchment scrolling.
		sx = (players[consoleplayer].camera->X() - f_oldloc.x);
		sy = (f_oldloc.y - players[consoleplayer].camera->Y());
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotate (&sx, &sy, players[consoleplayer].camera->Angles.Yaw - 90);
		}
		AM_ScrollParchment (sx, sy);

		f_oldloc.x = players[consoleplayer].camera->X();
		f_oldloc.y = players[consoleplayer].camera->Y();
	}
}